

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O0

CURLcode tftp_set_timeouts(tftp_state_data *state)

{
  timediff_t tVar1;
  time_t tVar2;
  _Bool start;
  timediff_t timeout_ms;
  time_t timeout;
  time_t maxtime;
  tftp_state_data *state_local;
  
  tVar1 = Curl_timeleft(state->data,(curltime *)0x0,state->state == TFTP_STATE_START);
  if (tVar1 < 0) {
    Curl_failf(state->data,"Connection time-out");
    state_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
  }
  else {
    if (tVar1 < 1) {
      timeout = 0xe10;
    }
    else {
      timeout = (tVar1 + 500) / 1000;
    }
    state->retry_max =
         (int)((long)((ulong)(uint)((int)timeout >> 0x1f) << 0x20 | timeout & 0xffffffffU) / 5);
    if (state->retry_max < 3) {
      state->retry_max = 3;
    }
    if (0x32 < state->retry_max) {
      state->retry_max = 0x32;
    }
    state->retry_time = (int)(timeout / (long)state->retry_max);
    if (state->retry_time < 1) {
      state->retry_time = 1;
    }
    if (((state->data != (Curl_easy *)0x0) &&
        ((*(ulong *)&(state->data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((state->data->state).feat == (curl_trc_feat *)0x0 ||
        (0 < ((state->data->state).feat)->log_level)))) {
      Curl_infof(state->data,"set timeouts for state %d; Total % ld, retry %d maxtry %d",
                 (ulong)state->state,tVar1,(ulong)(uint)state->retry_time,
                 (ulong)(uint)state->retry_max);
    }
    tVar2 = time((time_t *)0x0);
    state->rx_time = tVar2;
    state_local._4_4_ = CURLE_OK;
  }
  return state_local._4_4_;
}

Assistant:

static CURLcode tftp_set_timeouts(struct tftp_state_data *state)
{
  time_t maxtime, timeout;
  timediff_t timeout_ms;
  bool start = (state->state == TFTP_STATE_START) ? TRUE : FALSE;

  /* Compute drop-dead time */
  timeout_ms = Curl_timeleft(state->data, NULL, start);

  if(timeout_ms < 0) {
    /* time-out, bail out, go home */
    failf(state->data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  if(timeout_ms > 0)
    maxtime = (time_t)(timeout_ms + 500) / 1000;
  else
    maxtime = 3600; /* use for calculating block timeouts */

  /* Set per-block timeout to total */
  timeout = maxtime;

  /* Average reposting an ACK after 5 seconds */
  state->retry_max = (int)timeout/5;

  /* But bound the total number */
  if(state->retry_max<3)
    state->retry_max = 3;

  if(state->retry_max>50)
    state->retry_max = 50;

  /* Compute the re-ACK interval to suit the timeout */
  state->retry_time = (int)(timeout/state->retry_max);
  if(state->retry_time<1)
    state->retry_time = 1;

  infof(state->data,
        "set timeouts for state %d; Total % " FMT_OFF_T ", retry %d maxtry %d",
        (int)state->state, timeout_ms, state->retry_time, state->retry_max);

  /* init RX time */
  state->rx_time = time(NULL);

  return CURLE_OK;
}